

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_imul(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  Value VVar2;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  if (VVar1.type != INT) {
    __assert_fail("value_2.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x82b,"void ExecutionEngine::i_imul()");
  }
  if ((VVar2._0_8_ & 0xffffffff00000000) == 0x400000000) {
    VVar1.data.longValue =
         VVar2.data.longValue & 0xffffffff00000000U |
         (ulong)(uint)(VVar1.data._0_4_ * VVar2.data._0_4_);
    VVar1.printType = INT;
    VVar1.type = INT;
    Frame::pushIntoOperandStack(this_01,VVar1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x82c,"void ExecutionEngine::i_imul()");
}

Assistant:

void ExecutionEngine::i_imul() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::INT);
	assert(value_1.type == ValueType::INT);

    value_1.printType = ValueType::INT;
	value_1.data.intValue = value_1.data.intValue * (value_2.data.intValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}